

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

size_t testing::internal::GetThreadCount(void)

{
  DIR *__dirp;
  dirent *pdVar1;
  dirent *entry;
  DIR *dir;
  size_t thread_count;
  size_t local_8;
  
  local_8 = 0;
  __dirp = opendir("/proc/self/task");
  if (__dirp != (DIR *)0x0) {
    while (pdVar1 = readdir(__dirp), pdVar1 != (dirent *)0x0) {
      if (pdVar1->d_name[0] != '.') {
        local_8 = local_8 + 1;
      }
    }
    closedir(__dirp);
  }
  return local_8;
}

Assistant:

size_t GetThreadCount() {
  size_t thread_count = 0;
  if (DIR *dir = opendir("/proc/self/task")) {
    while (dirent *entry = readdir(dir)) {
      if (entry->d_name[0] != '.')
        ++thread_count;
    }
    closedir(dir);
  }
  return thread_count;
}